

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O2

int absl::lts_20250127::str_format_internal::FprintF
              (FILE *output,UntypedFormatSpecImpl format,
              Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  FormatRawSinkImpl raw_sink;
  FILERawSink sink;
  
  sink.error_ = 0;
  sink.count_ = 0;
  raw_sink.write_ = FormatRawSinkImpl::Flush<absl::lts_20250127::str_format_internal::FILERawSink>;
  raw_sink.sink_ = &sink;
  sink.output_ = output;
  bVar2 = FormatUntyped(raw_sink,format,args);
  iVar1 = sink.error_;
  if (bVar2) {
    if (sink.error_ == 0) {
      if ((sink.count_ & 0xffffffff80000000) == 0) goto LAB_0028d91e;
      piVar3 = __errno_location();
      *piVar3 = 0x1b;
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = iVar1;
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  sink.count_ = 0xffffffffffffffff;
LAB_0028d91e:
  return (int)sink.count_;
}

Assistant:

int FprintF(std::FILE* output, const UntypedFormatSpecImpl format,
            absl::Span<const FormatArgImpl> args) {
  FILERawSink sink(output);
  if (!FormatUntyped(&sink, format, args)) {
    errno = EINVAL;
    return -1;
  }
  if (sink.error()) {
    errno = sink.error();
    return -1;
  }
  if (sink.count() > static_cast<size_t>(std::numeric_limits<int>::max())) {
    errno = EFBIG;
    return -1;
  }
  return static_cast<int>(sink.count());
}